

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwd_txfm_sse2.h
# Opt level: O0

void storeu_output(__m128i *poutput,tran_low_t *dst_ptr)

{
  long lVar1;
  long lVar2;
  longlong lVar3;
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  __m128i out1;
  __m128i out0;
  __m128i sign_bits;
  __m128i zero;
  tran_low_t *dst_ptr_local;
  __m128i *poutput_local;
  short local_28;
  short sStack_26;
  short sStack_24;
  short sStack_20;
  short sStack_1e;
  short sStack_1c;
  
  lVar1 = (*poutput)[0];
  lVar2 = (*poutput)[1];
  local_28 = (short)lVar1;
  sStack_26 = (short)((ulong)lVar1 >> 0x10);
  sStack_24 = (short)((ulong)lVar1 >> 0x20);
  sStack_20 = (short)lVar2;
  sStack_1e = (short)((ulong)lVar2 >> 0x10);
  sStack_1c = (short)((ulong)lVar2 >> 0x20);
  lVar3 = (*poutput)[0];
  uStack_88 = (undefined2)lVar3;
  uStack_86 = (undefined2)((ulong)lVar3 >> 0x10);
  uStack_84 = (undefined2)((ulong)lVar3 >> 0x20);
  uStack_82 = (undefined2)((ulong)lVar3 >> 0x30);
  lVar3 = (*poutput)[1];
  sign_bits[0]._0_2_ = (undefined2)lVar3;
  sign_bits[0]._2_2_ = (undefined2)((ulong)lVar3 >> 0x10);
  sign_bits[0]._4_2_ = (undefined2)((ulong)lVar3 >> 0x20);
  sign_bits[0]._6_2_ = (undefined2)((ulong)lVar3 >> 0x30);
  *(ulong *)dst_ptr =
       CONCAT26(-(ushort)(sStack_26 < 0),
                CONCAT24(uStack_86,CONCAT22(-(ushort)(local_28 < 0),uStack_88)));
  *(ulong *)(dst_ptr + 2) =
       CONCAT26(-(ushort)(lVar1 < 0),
                CONCAT24(uStack_82,CONCAT22(-(ushort)(sStack_24 < 0),uStack_84)));
  *(ulong *)(dst_ptr + 4) =
       CONCAT26(-(ushort)(sStack_1e < 0),
                CONCAT24(sign_bits[0]._2_2_,
                         CONCAT22(-(ushort)(sStack_20 < 0),(undefined2)sign_bits[0])));
  *(ulong *)(dst_ptr + 6) =
       CONCAT26(-(ushort)(lVar2 < 0),
                CONCAT24(sign_bits[0]._6_2_,CONCAT22(-(ushort)(sStack_1c < 0),sign_bits[0]._4_2_)));
  return;
}

Assistant:

static inline void storeu_output(const __m128i *poutput, tran_low_t *dst_ptr) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i sign_bits = _mm_cmplt_epi16(*poutput, zero);
  __m128i out0 = _mm_unpacklo_epi16(*poutput, sign_bits);
  __m128i out1 = _mm_unpackhi_epi16(*poutput, sign_bits);
  _mm_storeu_si128((__m128i *)(dst_ptr), out0);
  _mm_storeu_si128((__m128i *)(dst_ptr + 4), out1);
}